

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::~BaseDictionary(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this)

{
  int *buckets;
  EntryType *entries;
  
  buckets = (this->buckets).ptr;
  if (buckets != (int *)0x0) {
    DeleteBuckets(this,buckets,this->bucketCount);
  }
  entries = (this->entries).ptr;
  if (entries != (EntryType *)0x0) {
    DeleteEntries(this,entries,this->size);
  }
  return;
}

Assistant:

~BaseDictionary()
        {
            if (buckets)
            {
                DeleteBuckets(buckets, bucketCount);
            }

            if (entries)
            {
                DeleteEntries(entries, size);
            }
        }